

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ur_kin.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  double *T;
  ulong uVar2;
  double *pdVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  double dVar8;
  double q [6];
  double q_sols [48];
  
  q[3] = 0.0;
  q[5] = 0.0;
  q[0] = 0.0;
  q[1] = 0.0;
  q[2] = 1.0;
  q[4] = 1.0;
  T = (double *)operator_new__(0x80);
  ur_kinematics::forward(q,T);
  pdVar3 = T;
  for (iVar6 = 0; iVar6 != 4; iVar6 = iVar6 + 1) {
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      printf("%1.3f ",pdVar3[lVar4]);
    }
    putchar(10);
    pdVar3 = pdVar3 + 4;
  }
  uVar1 = ur_kinematics::inverse(T,q_sols,0.0);
  uVar5 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar5;
  }
  for (; uVar2 * 0x30 - uVar5 != 0; uVar5 = uVar5 + 0x30) {
    printf("%1.6f %1.6f %1.6f %1.6f %1.6f %1.6f\n",*(undefined8 *)((long)q_sols + uVar5),
           *(undefined8 *)((long)q_sols + uVar5 + 8),*(undefined8 *)((long)q_sols + uVar5 + 0x10),
           *(undefined8 *)((long)q_sols + uVar5 + 0x18),*(undefined8 *)((long)q_sols + uVar5 + 0x20)
           ,*(undefined8 *)((long)q_sols + uVar5 + 0x28));
  }
  dVar8 = 0.0;
  iVar6 = 5;
  while (bVar7 = iVar6 != 0, iVar6 = iVar6 + -1, bVar7) {
    printf("%f ",dVar8 * 1.570796326794895);
    dVar8 = dVar8 + 1.0;
  }
  putchar(10);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
  double q[6] = {0.0, 0.0, 1.0, 0.0, 1.0, 0.0};
  double* T = new double[16];
  forward(q, T);
  for(int i=0;i<4;i++) {
    for(int j=i*4;j<(i+1)*4;j++)
      printf("%1.3f ", T[j]);
    printf("\n");
  }
  double q_sols[8*6];
  int num_sols;
  num_sols = inverse(T, q_sols);
  for(int i=0;i<num_sols;i++)
    printf("%1.6f %1.6f %1.6f %1.6f %1.6f %1.6f\n",
       q_sols[i*6+0], q_sols[i*6+1], q_sols[i*6+2], q_sols[i*6+3], q_sols[i*6+4], q_sols[i*6+5]);
  for(int i=0;i<=4;i++)
    printf("%f ", IKPI/2.0*i);
  printf("\n");
  return 0;
}